

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  NullableValue<kj::Array<unsigned_char>_> *this_01;
  Array<unsigned_char> *this_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  long *plVar2;
  byte bVar3;
  SourceLocation location;
  undefined7 uVar4;
  bool bVar5;
  coroutine_handle<void> handle;
  Array<unsigned_char> *pAVar6;
  uchar *puVar7;
  size_t sVar8;
  undefined7 in_register_00000031;
  long lVar9;
  undefined8 in_R8;
  Mask mask;
  undefined8 in_R9;
  ArrayPtr<const_unsigned_char> AVar10;
  DebugExpression<bool> _kjCondition_2;
  Fault f;
  undefined8 uVar11;
  undefined8 in_stack_ffffffffffffff58;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_7f;
  size_t local_78;
  NullableValue<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_> *local_70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *local_68;
  Mask *local_60;
  long local_58;
  uchar local_4c [4];
  Maybe<kj::EntropySource_&> local_48;
  Maybe<unsigned_long> local_40;
  
  lVar9 = CONCAT71(in_register_00000031,opcode);
  handle._M_fr_ptr = operator_new(0x658);
  *(code **)handle._M_fr_ptr = sendImpl;
  *(code **)((long)handle._M_fr_ptr + 8) = sendImpl;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x648) = in_R8;
  *(size_t *)((long)handle._M_fr_ptr + 0x640) = message.size_;
  *(char *)((long)handle._M_fr_ptr + 0x656) = (char)message.ptr;
  *(long *)((long)handle._M_fr_ptr + 0x638) = lVar9;
  f.exception = (Exception *)anon_var_dwarf_67f91a;
  uVar11 = (uchar *)0x1500000dae;
  location.function = "sendImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xdae;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  uVar4 = uStack_7f;
  __kjCondition = (uchar *)(CONCAT71(uStack_7f,*(char *)(lVar9 + 0x161)) ^ 1);
  if (*(char *)(lVar9 + 0x161) != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdaf,FAILED,"!disconnected",
               "_kjCondition,\"WebSocket can\'t send after disconnect()\"",&_kjCondition,
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    kj::_::Debug::Fault::fatal(&f);
  }
  __kjCondition = (uchar *)(CONCAT71(uVar4,*(char *)(lVar9 + 0x162)) ^ 1);
  if (*(char *)(lVar9 + 0x162) != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdb0,FAILED,"!currentlySending",
               "_kjCondition,\"another message send is already in progress\"",&_kjCondition,
               (char (*) [44])"another message send is already in progress");
    kj::_::Debug::Fault::fatal(&f);
  }
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x410);
  local_70 = (NullableValue<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_> *)
             ((long)handle._M_fr_ptr + 0x5c8);
  this_01 = (NullableValue<kj::Array<unsigned_char>_> *)((long)handle._M_fr_ptr + 0x5f0);
  local_58 = (long)handle._M_fr_ptr + 0x3f0;
  this_02 = (Array<unsigned_char> *)((long)handle._M_fr_ptr + 0x610);
  pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x628);
  local_68 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x630);
  local_60 = (Mask *)((long)handle._M_fr_ptr + 0x650);
  *(undefined1 *)(lVar9 + 0x162) = 1;
  while( true ) {
    mask.maskBytes = SUB84(in_R9,0);
    lVar9 = *(long *)((long)handle._M_fr_ptr + 0x638);
    if (*(char *)(lVar9 + 0x348) != '\x01') {
      *(byte *)(lVar9 + 0x160) =
           *(byte *)(lVar9 + 0x160) | *(char *)((long)handle._M_fr_ptr + 0x656) == '\b';
      local_48.ptr = *(EntropySource **)(lVar9 + 0x20);
      Mask::Mask(local_60,&local_48);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x5f0) = 0;
      if (((byte)(*(char *)((long)handle._M_fr_ptr + 0x656) - 1U) < 2) &&
         (lVar9 = *(long *)((long)handle._M_fr_ptr + 0x638), *(char *)(lVar9 + 0x28) != '\0')) {
        if (*(char *)(lVar9 + 0x60) == '\0') {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0xdd1,FAILED,"compressionContext != nullptr","");
          kj::_::Debug::Fault::fatal(&f);
        }
        if (*(char *)(lVar9 + 0x30) == '\x01') {
          ZlibContext::reset((ZlibContext *)(lVar9 + 0x68));
        }
        puVar7 = *(uchar **)((long)handle._M_fr_ptr + 0x648);
        local_40.ptr.isSet = false;
        mask.maskBytes[0] = '\0';
        mask.maskBytes[1] = '\0';
        mask.maskBytes[2] = '\0';
        mask.maskBytes[3] = '\0';
        ZlibContext::processMessage
                  ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)&f,
                   (ZlibContext *)(lVar9 + 0x68),
                   *(ArrayPtr<const_unsigned_char> *)((long)handle._M_fr_ptr + 0x640),&local_40,
                   false);
        kj::_::NullableValue<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
        NullableValue(local_70,(OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)&f);
        OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::~OneOf
                  ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)&f);
        if (*(int *)((long)handle._M_fr_ptr + 0x5d0) == 1) {
          lVar9 = *(long *)((long)handle._M_fr_ptr + 0x648);
          pAVar6 = kj::_::NullableValue<kj::Array<unsigned_char>>::emplace<kj::Array<unsigned_char>>
                             ((NullableValue<kj::Array<unsigned_char>> *)this_01,
                              (Array<unsigned_char> *)((long)handle._M_fr_ptr + 0x5d8));
          if (lVar9 == 0) {
            __kjCondition = (uchar *)((ulong)__kjCondition & 0xffffffffffffff00);
            heapArray<unsigned_char,unsigned_char_const*>
                      ((Array<unsigned_char> *)&f,(kj *)&_kjCondition,(uchar *)&uStack_7f,puVar7);
            pAVar6 = kj::_::NullableValue<kj::Array<unsigned_char>>::
                     emplace<kj::Array<unsigned_char>>
                               ((NullableValue<kj::Array<unsigned_char>> *)this_01,
                                (Array<unsigned_char> *)&f);
            puVar7 = pAVar6->ptr;
            sVar8 = pAVar6->size_;
            Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
          }
          else {
            f.exception = (Exception *)pAVar6->ptr;
            __kjCondition = local_4c;
            local_4c[0] = '\0';
            local_4c[1] = '\0';
            local_4c[2] = 0xff;
            local_4c[3] = 0xff;
            local_78 = 4;
            _kjCondition_2.value =
                 ArrayPtr<unsigned_char>::endsWith
                           ((ArrayPtr<unsigned_char> *)&f,
                            (ArrayPtr<const_unsigned_char> *)&_kjCondition);
            if (!_kjCondition_2.value) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,0xdde,FAILED,"innerMessage.asPtr().endsWith({0x00, 0x00, 0xFF, 0xFF})",
                         "_kjCondition,",&_kjCondition_2);
              kj::_::Debug::Fault::fatal(&f);
            }
            puVar7 = pAVar6->ptr;
            sVar8 = pAVar6->size_ - 4;
          }
        }
        else {
          if (*(int *)((long)handle._M_fr_ptr + 0x5d0) == 2) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::StringPtr&>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0xdd9,FAILED,(char *)0x0,
                       "\"Error compressing websocket message: \", error.description",
                       (char (*) [38])"Error compressing websocket message: ",
                       (StringPtr *)((long)handle._M_fr_ptr + 0x5e0));
            kj::_::Debug::Fault::fatal(&f);
          }
          puVar7 = *(uchar **)((long)handle._M_fr_ptr + 0x640);
          sVar8 = *(size_t *)((long)handle._M_fr_ptr + 0x648);
        }
        kj::_::NullableValue<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
        ~NullableValue(local_70);
        bVar5 = true;
      }
      else {
        puVar7 = *(uchar **)((long)handle._M_fr_ptr + 0x640);
        sVar8 = *(size_t *)((long)handle._M_fr_ptr + 0x648);
        bVar5 = false;
      }
      *(undefined8 *)((long)handle._M_fr_ptr + 0x620) = 0;
      this_02->ptr = (uchar *)0x0;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x618) = 0;
      if (*(int *)local_60->maskBytes != 0) {
        AVar10.size_ = in_stack_ffffffffffffff58;
        AVar10.ptr = (uchar *)uVar11;
        heapArray<unsigned_char>(AVar10);
        Array<unsigned_char>::operator=(this_02,(Array<unsigned_char> *)&f);
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
        Mask::apply(local_60,*(ArrayPtr<unsigned_char> *)((long)handle._M_fr_ptr + 0x610));
        puVar7 = *(uchar **)((long)handle._M_fr_ptr + 0x610);
        sVar8 = *(size_t *)((long)handle._M_fr_ptr + 0x618);
      }
      lVar9 = *(long *)((long)handle._M_fr_ptr + 0x638);
      AVar10 = Header::compose((Header *)(lVar9 + 0x163),bVar5,
                               *(bool *)((long)handle._M_fr_ptr + 0x656),(byte)sVar8,
                               (ulong)*(uint *)((long)handle._M_fr_ptr + 0x650),mask);
      pOVar1 = local_68;
      *(ArrayPtr<const_unsigned_char> *)((long)handle._M_fr_ptr + 0x3f0) = AVar10;
      *(uchar **)((long)handle._M_fr_ptr + 0x400) = puVar7;
      *(size_t *)((long)handle._M_fr_ptr + 0x408) = sVar8;
      bVar5 = (*(byte *)(lVar9 + 0x163) & 0x30) == 0;
      __kjCondition = (uchar *)CONCAT71(uStack_7f,bVar5);
      if (bVar5) {
        lVar9 = *(long *)(*(long *)((long)handle._M_fr_ptr + 0x638) + 0x18);
        (**(code **)(*(long *)(lVar9 + 8) + 8))(local_68,lVar9 + 8,local_58,2);
        co_await<void>(__return_storage_ptr___00,(Promise<void> *)pOVar1);
        *(undefined1 *)((long)handle._M_fr_ptr + 0x654) = 1;
        bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00)
        ;
        if (!bVar5) {
          kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
          kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_68);
          lVar9 = *(long *)((long)handle._M_fr_ptr + 0x638);
          *(undefined1 *)(lVar9 + 0x162) = 0;
          if (*(char *)(lVar9 + 0x310) == '\x01') {
            setUpSendingControlMessage(*(WebSocketImpl **)((long)handle._M_fr_ptr + 0x638));
          }
          plVar2 = (long *)(*(long *)((long)handle._M_fr_ptr + 0x638) + 0x3a8);
          *plVar2 = *plVar2 + *(long *)((long)handle._M_fr_ptr + 0x408) +
                              *(long *)((long)handle._M_fr_ptr + 0x3f8);
          Array<unsigned_char>::~Array(this_02);
          kj::_::NullableValue<kj::Array<unsigned_char>_>::~NullableValue(this_01);
          kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                    ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
          *(undefined8 *)handle._M_fr_ptr = 0;
          *(undefined1 *)((long)handle._M_fr_ptr + 0x654) = 2;
        }
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[98]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xdf9,FAILED,"!sendHeader.hasRsv2or3()",
                 "_kjCondition,\"RSV bits 2 and 3 must be 0, as we do not currently \" \"support an extension that would set these bits\""
                 ,&_kjCondition,
                 (char (*) [98])
                 "RSV bits 2 and 3 must be 0, as we do not currently support an extension that would set these bits"
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    bVar3 = *(byte *)(lVar9 + 0x161);
    ((DebugExpression<bool> *)((long)handle._M_fr_ptr + 0x655))->value = (bool)(bVar3 ^ 1);
    if (bVar3 != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xdb7,FAILED,"!disconnected",
                 "_kjCondition,\"WebSocket can\'t send after disconnect()\"",
                 (DebugExpression<bool> *)((long)handle._M_fr_ptr + 0x655),
                 (char (*) [40])"WebSocket can\'t send after disconnect()");
      kj::_::Debug::Fault::fatal(&f);
    }
    pOVar1->ptr = *(PromiseNode **)(lVar9 + 0x350);
    *(undefined8 *)(lVar9 + 0x350) = 0;
    Maybe<kj::Promise<void>_>::operator=((Maybe<kj::Promise<void>_> *)(lVar9 + 0x348));
    co_await<void>(__return_storage_ptr__,(Promise<void> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x654) = 0;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar5) break;
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    for (;;) {
      KJ_IF_SOME(p, sendingControlMessage) {
        // Re-check in case of disconnect on a previous loop iteration.
        KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");

        // We recently sent a control message; make sure it's finished before proceeding.
        auto localPromise = kj::mv(p);
        sendingControlMessage = kj::none;
        co_await localPromise;
      } else {
        break;
      }
    }